

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_write_resp_hd(Curl_easy *data,char *hd,size_t hdlen,_Bool is_eos)

{
  CURLcode CVar1;
  char tmp;
  size_t consumed;
  char local_19;
  size_t local_18;
  
  local_19 = '\0';
  CVar1 = http_rw_hd(data,hd,hdlen,&local_19,0,&local_18);
  if (CVar1 == CURLE_OK && is_eos) {
    CVar1 = Curl_client_write(data,0x81,&local_19,0);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_http_write_resp_hd(struct Curl_easy *data,
                                 const char *hd, size_t hdlen,
                                 bool is_eos)
{
  CURLcode result;
  size_t consumed;
  char tmp = 0;

  result = http_rw_hd(data, hd, hdlen, &tmp, 0, &consumed);
  if(!result && is_eos) {
    result = Curl_client_write(data, (CLIENTWRITE_BODY|CLIENTWRITE_EOS),
                               &tmp, 0);
  }
  return result;
}